

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crl_app.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  char *q;
  char *p;
  undefined1 auStack_18868 [4];
  int i;
  mbedtls_x509_crl crl;
  uchar buf [100000];
  uint local_1c;
  int ret;
  char **argv_local;
  int argc_local;
  
  local_1c = 0;
  mbedtls_x509_crl_init((mbedtls_x509_crl *)auStack_18868);
  if (argc == 0) {
LAB_0010b314:
    printf(
          "\n usage: crl_app param=<>...\n\n acceptable parameters:\n    filename=%%s         default: crl.pem\n\n"
          );
  }
  else {
    opt.filename = "crl.pem";
    for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
      __s = argv[p._4_4_];
      pcVar2 = strchr(__s,0x3d);
      if (pcVar2 == (char *)0x0) goto LAB_0010b314;
      *pcVar2 = '\0';
      iVar1 = strcmp(__s,"filename");
      if (iVar1 != 0) goto LAB_0010b314;
      opt.filename = pcVar2 + 1;
    }
    printf("\n  . Loading the CRL ...");
    fflush(_stdout);
    local_1c = mbedtls_x509_crl_parse_file((mbedtls_x509_crl *)auStack_18868,opt.filename);
    if (local_1c == 0) {
      printf(" ok\n");
      printf("  . CRL information    ...\n");
      local_1c = mbedtls_x509_crl_info
                           ((char *)&crl.next,99999,"      ",(mbedtls_x509_crl *)auStack_18868);
      if (local_1c == 0xffffffff) {
        printf(" failed\n  !  mbedtls_x509_crl_info returned %d\n\n",0xffffffff);
        mbedtls_x509_crl_free((mbedtls_x509_crl *)auStack_18868);
      }
      else {
        printf("%s\n",&crl.next);
      }
    }
    else {
      printf(" failed\n  !  mbedtls_x509_crl_parse_file returned %d\n\n",(ulong)local_1c);
      mbedtls_x509_crl_free((mbedtls_x509_crl *)auStack_18868);
    }
  }
  mbedtls_x509_crl_free((mbedtls_x509_crl *)auStack_18868);
  return local_1c;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    unsigned char buf[100000];
    mbedtls_x509_crl crl;
    int i;
    char *p, *q;

    /*
     * Set to sane values
     */
    mbedtls_x509_crl_init( &crl );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        goto exit;
    }

    opt.filename            = DFL_FILENAME;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else
            goto usage;
    }

    /*
     * 1.1. Load the CRL
     */
    mbedtls_printf( "\n  . Loading the CRL ..." );
    fflush( stdout );

    ret = mbedtls_x509_crl_parse_file( &crl, opt.filename );

    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crl_parse_file returned %d\n\n", ret );
        mbedtls_x509_crl_free( &crl );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    /*
     * 1.2 Print the CRL
     */
    mbedtls_printf( "  . CRL information    ...\n" );
    ret = mbedtls_x509_crl_info( (char *) buf, sizeof( buf ) - 1, "      ", &crl );
    if( ret == -1 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crl_info returned %d\n\n", ret );
        mbedtls_x509_crl_free( &crl );
        goto exit;
    }

    mbedtls_printf( "%s\n", buf );

exit:
    mbedtls_x509_crl_free( &crl );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}